

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ParameterSymbol::serializeTo(ParameterSymbol *this,ASTSerializer *serializer)

{
  ConstantValue *__n;
  
  __n = getValue(this,(SourceRange)ZEXT816(0));
  ASTSerializer::write(serializer,5,"value",(size_t)__n);
  ASTSerializer::write(serializer,7,"isLocal",(ulong)(this->super_ParameterSymbolBase).isLocal);
  ASTSerializer::write(serializer,6,"isPort",(ulong)(this->super_ParameterSymbolBase).isPort);
  ASTSerializer::write(serializer,6,"isBody",(ulong)((this->super_ParameterSymbolBase).isPort ^ 1));
  return;
}

Assistant:

void ParameterSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("value", getValue());
    serializer.write("isLocal", isLocalParam());
    serializer.write("isPort", isPortParam());
    serializer.write("isBody", isBodyParam());
}